

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insyde_fdm.cpp
# Opt level: O0

void __thiscall insyde_fdm_t::_read(insyde_fdm_t *this)

{
  uint8_t uVar1;
  byte bVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint64_t uVar6;
  kstream *pkVar7;
  fdm_extensions_t *pfVar8;
  pointer pkVar9;
  vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>
  *this_00;
  reference this_01;
  pointer this_02;
  fdm_board_ids_t *this_03;
  fdm_entries_t *this_04;
  unique_ptr<insyde_fdm_t::fdm_entries_t,_std::default_delete<insyde_fdm_t::fdm_entries_t>_>
  local_88;
  unique_ptr<kaitai::kstream,std::default_delete<kaitai::kstream>> local_80 [8];
  string local_78;
  unique_ptr<insyde_fdm_t::fdm_board_ids_t,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
  local_58;
  unique_ptr<insyde_fdm_t::fdm_extensions_t,_std::default_delete<insyde_fdm_t::fdm_extensions_t>_>
  local_50 [3];
  unique_ptr<kaitai::kstream,std::default_delete<kaitai::kstream>> local_38 [8];
  string local_30;
  insyde_fdm_t *local_10;
  insyde_fdm_t *this_local;
  
  local_10 = this;
  uVar4 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_signature = uVar4;
  uVar4 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_store_size = uVar4;
  uVar4 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_data_offset = uVar4;
  uVar4 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_entry_size = uVar4;
  uVar1 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_entry_format = uVar1;
  uVar1 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_revision = uVar1;
  uVar1 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_num_extensions = uVar1;
  uVar1 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_checksum = uVar1;
  uVar6 = kaitai::kstream::read_u8le((this->super_kstruct).m__io);
  this->m_fd_base_address = uVar6;
  this->n_extensions = true;
  bVar2 = revision(this);
  if (2 < bVar2) {
    this->n_extensions = false;
    pkVar7 = (this->super_kstruct).m__io;
    bVar2 = num_extensions(this);
    kaitai::kstream::read_bytes_abi_cxx11_(&local_30,pkVar7,(ulong)bVar2 << 2);
    std::__cxx11::string::operator=((string *)&this->m__raw_extensions,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    pkVar7 = (kstream *)operator_new(0x198);
    kaitai::kstream::kstream(pkVar7,&this->m__raw_extensions);
    std::unique_ptr<kaitai::kstream,std::default_delete<kaitai::kstream>>::
    unique_ptr<std::default_delete<kaitai::kstream>,void>(local_38,pkVar7);
    std::unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_>::operator=
              (&this->m__io__raw_extensions,
               (unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_> *)local_38);
    std::unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_>::~unique_ptr
              ((unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_> *)local_38);
    pfVar8 = (fdm_extensions_t *)operator_new(0x28);
    pkVar9 = std::unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_>::get
                       (&this->m__io__raw_extensions);
    fdm_extensions_t::fdm_extensions_t(pfVar8,pkVar9,this,this->m__root);
    std::
    unique_ptr<insyde_fdm_t::fdm_extensions_t,std::default_delete<insyde_fdm_t::fdm_extensions_t>>::
    unique_ptr<std::default_delete<insyde_fdm_t::fdm_extensions_t>,void>
              ((unique_ptr<insyde_fdm_t::fdm_extensions_t,std::default_delete<insyde_fdm_t::fdm_extensions_t>>
                *)local_50,pfVar8);
    std::
    unique_ptr<insyde_fdm_t::fdm_extensions_t,_std::default_delete<insyde_fdm_t::fdm_extensions_t>_>
    ::operator=(&this->m_extensions,local_50);
    std::
    unique_ptr<insyde_fdm_t::fdm_extensions_t,_std::default_delete<insyde_fdm_t::fdm_extensions_t>_>
    ::~unique_ptr(local_50);
  }
  this->n_board_ids = true;
  bVar2 = revision(this);
  if (2 < bVar2) {
    pfVar8 = extensions(this);
    this_00 = fdm_extensions_t::extensions(pfVar8);
    this_01 = std::
              vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>
              ::at(this_00,1);
    this_02 = std::
              unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>
              ::operator->(this_01);
    uVar3 = fdm_extension_t::count(this_02);
    if (uVar3 != 0) {
      this->n_board_ids = false;
      this_03 = (fdm_board_ids_t *)operator_new(0x30);
      fdm_board_ids_t::fdm_board_ids_t(this_03,(this->super_kstruct).m__io,this,this->m__root);
      std::
      unique_ptr<insyde_fdm_t::fdm_board_ids_t,std::default_delete<insyde_fdm_t::fdm_board_ids_t>>::
      unique_ptr<std::default_delete<insyde_fdm_t::fdm_board_ids_t>,void>
                ((unique_ptr<insyde_fdm_t::fdm_board_ids_t,std::default_delete<insyde_fdm_t::fdm_board_ids_t>>
                  *)&local_58,this_03);
      std::
      unique_ptr<insyde_fdm_t::fdm_board_ids_t,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
      ::operator=(&this->m_board_ids,&local_58);
      std::
      unique_ptr<insyde_fdm_t::fdm_board_ids_t,_std::default_delete<insyde_fdm_t::fdm_board_ids_t>_>
      ::~unique_ptr(&local_58);
    }
  }
  pkVar7 = (this->super_kstruct).m__io;
  uVar4 = store_size(this);
  uVar5 = data_offset(this);
  kaitai::kstream::read_bytes_abi_cxx11_(&local_78,pkVar7,(ulong)(uVar4 - uVar5));
  std::__cxx11::string::operator=((string *)&this->m__raw_entries,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  pkVar7 = (kstream *)operator_new(0x198);
  kaitai::kstream::kstream(pkVar7,&this->m__raw_entries);
  std::unique_ptr<kaitai::kstream,std::default_delete<kaitai::kstream>>::
  unique_ptr<std::default_delete<kaitai::kstream>,void>(local_80,pkVar7);
  std::unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_>::operator=
            (&this->m__io__raw_entries,
             (unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_> *)local_80);
  std::unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_>::~unique_ptr
            ((unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_> *)local_80);
  this_04 = (fdm_entries_t *)operator_new(0x28);
  pkVar9 = std::unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_>::get
                     (&this->m__io__raw_entries);
  fdm_entries_t::fdm_entries_t(this_04,pkVar9,this,this->m__root);
  std::unique_ptr<insyde_fdm_t::fdm_entries_t,std::default_delete<insyde_fdm_t::fdm_entries_t>>::
  unique_ptr<std::default_delete<insyde_fdm_t::fdm_entries_t>,void>
            ((unique_ptr<insyde_fdm_t::fdm_entries_t,std::default_delete<insyde_fdm_t::fdm_entries_t>>
              *)&local_88,this_04);
  std::unique_ptr<insyde_fdm_t::fdm_entries_t,_std::default_delete<insyde_fdm_t::fdm_entries_t>_>::
  operator=(&this->m_entries,&local_88);
  std::unique_ptr<insyde_fdm_t::fdm_entries_t,_std::default_delete<insyde_fdm_t::fdm_entries_t>_>::
  ~unique_ptr(&local_88);
  return;
}

Assistant:

void insyde_fdm_t::_read() {
    m_signature = m__io->read_u4le();
    m_store_size = m__io->read_u4le();
    m_data_offset = m__io->read_u4le();
    m_entry_size = m__io->read_u4le();
    m_entry_format = m__io->read_u1();
    m_revision = m__io->read_u1();
    m_num_extensions = m__io->read_u1();
    m_checksum = m__io->read_u1();
    m_fd_base_address = m__io->read_u8le();
    n_extensions = true;
    if (revision() > 2) {
        n_extensions = false;
        m__raw_extensions = m__io->read_bytes((num_extensions() * 4));
        m__io__raw_extensions = std::unique_ptr<kaitai::kstream>(new kaitai::kstream(m__raw_extensions));
        m_extensions = std::unique_ptr<fdm_extensions_t>(new fdm_extensions_t(m__io__raw_extensions.get(), this, m__root));
    }
    n_board_ids = true;
    if ( ((revision() > 2) && (extensions()->extensions()->at(1)->count() > 0)) ) {
        n_board_ids = false;
        m_board_ids = std::unique_ptr<fdm_board_ids_t>(new fdm_board_ids_t(m__io, this, m__root));
    }
    m__raw_entries = m__io->read_bytes((store_size() - data_offset()));
    m__io__raw_entries = std::unique_ptr<kaitai::kstream>(new kaitai::kstream(m__raw_entries));
    m_entries = std::unique_ptr<fdm_entries_t>(new fdm_entries_t(m__io__raw_entries.get(), this, m__root));
}